

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::String::String(String *this,char *data)

{
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *data_local;
  String *this_local;
  
  local_18 = data;
  data_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,data,&local_39);
  ConvertToUnicode(&this->str,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

LiteScript::String::String(const char * data) : str(String::ConvertToUnicode(std::string(data))) {}